

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

void __thiscall
ot::commissioner::CommissionerImpl::RequestToken
          (CommissionerImpl *this,Handler<ByteArray> *aHandler,string *aAddr,uint16_t aPort)

{
  char *pcVar1;
  int iVar2;
  char *to;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *begin;
  char *from;
  bool bVar3;
  format_args args;
  writer write;
  _Any_data _Stack_d8;
  code *local_c8;
  undefined1 local_b8 [8];
  _Alloc_hider local_b0;
  char local_a0 [16];
  writer local_90;
  string local_88;
  format_string_checker<char> local_68;
  
  iVar2 = (*(this->super_Commissioner)._vptr_Commissioner[10])();
  if ((char)iVar2 == '\0') {
    local_68._0_8_ = (ulong)(uint)local_68._4_4_ << 0x20;
    from = "requesting COM_TOK is only valid in CCM Mode";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "requesting COM_TOK is only valid in CCM Mode";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x2c;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    local_90.handler_ = &local_68;
    local_68.context_.types_ = local_68.types_;
    do {
      if (from == "") break;
      to = from;
      if (*from == '{') {
LAB_001a0ab4:
        fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_90,from,to);
        from = fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (to,"",&local_68);
        bVar3 = true;
      }
      else {
        to = from + 1;
        bVar3 = to != "";
        if (bVar3) {
          if (*to != '{') {
            pcVar1 = from + 2;
            do {
              to = pcVar1;
              bVar3 = to != "";
              if (to == "") goto LAB_001a0ab0;
              pcVar1 = to + 1;
            } while (*to != '{');
          }
          bVar3 = true;
        }
LAB_001a0ab0:
        if (bVar3) goto LAB_001a0ab4;
        fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_90,from,"");
        bVar3 = false;
      }
    } while (bVar3);
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_68;
    fmt::v10::vformat_abi_cxx11_
              (&local_88,(v10 *)"requesting COM_TOK is only valid in CCM Mode",
               (string_view)ZEXT816(0x2c),args);
    local_b8._0_4_ = kInvalidState;
    local_b0._M_p = local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_88._M_dataplus._M_p,
               local_88._M_dataplus._M_p + local_88._M_string_length);
    local_68.types_[0] = none_type;
    local_68._4_4_ = 0;
    if ((aHandler->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*aHandler->_M_invoker)
              ((_Any_data *)aHandler,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> **)&local_68,(Error *)local_b8
              );
    if (local_b0._M_p != local_a0) {
      operator_delete(local_b0._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  else {
    std::
    function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
    ::function((function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
                *)&_Stack_d8,aHandler);
    TokenManager::RequestToken(&this->mTokenManager,(Handler<ByteArray> *)&_Stack_d8,aAddr,aPort);
    if (local_c8 != (code *)0x0) {
      (*local_c8)(&_Stack_d8,&_Stack_d8,__destroy_functor);
    }
  }
  return;
}

Assistant:

void CommissionerImpl::RequestToken(Handler<ByteArray> aHandler, const std::string &aAddr, uint16_t aPort)
{
    if (!IsCcmMode())
    {
        aHandler(nullptr, ERROR_INVALID_STATE("requesting COM_TOK is only valid in CCM Mode"));
    }
    else
    {
        mTokenManager.RequestToken(aHandler, aAddr, aPort);
    }
}